

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

void mainchan_try_fallback_command(mainchan *mc)

{
  _Bool _Var1;
  char *subsystem;
  char *cmd;
  mainchan *mc_local;
  
  subsystem = conf_get_str(mc->conf,0x15);
  _Var1 = conf_get_bool(mc->conf,0x31);
  if (_Var1) {
    sshfwd_start_subsystem(mc->sc,true,subsystem);
  }
  else {
    sshfwd_start_command(mc->sc,true,subsystem);
  }
  mc->req_cmd_fallback = true;
  return;
}

Assistant:

static void mainchan_try_fallback_command(mainchan *mc)
{
    const char *cmd = conf_get_str(mc->conf, CONF_remote_cmd2);
    if (conf_get_bool(mc->conf, CONF_ssh_subsys2)) {
        sshfwd_start_subsystem(mc->sc, true, cmd);
    } else {
        sshfwd_start_command(mc->sc, true, cmd);
    }
    mc->req_cmd_fallback = true;
}